

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

void DivisionHelper<unsigned_short,_signed_char,_1>::
     DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_short *t,char *u,unsigned_short *result)

{
  char cVar1;
  ushort uVar2;
  unsigned_short uVar3;
  
  cVar1 = *u;
  if (cVar1 == '\0') {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  uVar2 = *t;
  if (uVar2 != 0) {
    if ('\0' < cVar1) {
      uVar3 = (unsigned_short)((uint)uVar2 / ((int)cVar1 & 0xffffU));
      goto LAB_00110faf;
    }
    if (-1 < cVar1) {
      __assert_fail("t < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                    ,0x2ce,
                    "static std::uint32_t AbsValueHelper<signed char, 0>::Abs(T) [T = signed char]")
      ;
    }
    if ((byte)-cVar1 <= uVar2) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  uVar3 = 0;
LAB_00110faf:
  *result = uVar3;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {

        if( u == 0 )
            E::SafeIntOnDivZero();

        if( t == 0 )
        {
            result = 0;
            return;
        }

        if( u > 0 )
        {
            result = (T)( t/u );
            return;
        }

        // it is always an error to try and divide an unsigned number by a negative signed number
        // unless u is bigger than t
        if( AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( u ) > t )
        {
            result = 0;
            return;
        }

        E::SafeIntOnOverflow();
    }